

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1048b1::preprocessor<baryonyx::problem>::affects
          (preprocessor<baryonyx::problem> *this)

{
  int iVar1;
  pp_variable_value pVar2;
  int *piVar3;
  pointer piVar4;
  pointer ppVar5;
  long lVar6;
  int iVar7;
  pointer ppVar8;
  int *piVar9;
  bool value;
  pp_variable_value top;
  int local_58;
  bool local_54 [8];
  int local_4c;
  int local_48;
  int local_44;
  pp_lifo *local_40;
  _Hashtable<int,std::pair<int_const,bool>,std::allocator<std::pair<int_const,bool>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_38;
  
  ppVar5 = (this->lifo).data.
           super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->lifo).data.
      super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
      ._M_impl.super__Vector_impl_data._M_start != ppVar5) {
    local_40 = &this->lifo;
    local_38 = (_Hashtable<int,std::pair<int_const,bool>,std::allocator<std::pair<int_const,bool>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->vars;
    do {
      pVar2 = ppVar5[-1];
      (this->lifo).data.
      super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppVar5 + -1;
      local_58 = pVar2.index;
      local_54[0] = pVar2.value;
      std::
      _Hashtable<int,std::pair<int_const,bool>,std::allocator<std::pair<int_const,bool>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<int&,bool&>(local_38,&local_58,local_54);
      baryonyx::debug<std::basic_string_view<char,std::char_traits<char>>,bool>
                (this->ctx,"    - variable {} assigned to {}.\n",
                 (this->pb->vars).names.
                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + local_58,local_54);
      lVar6 = (long)local_58;
      ppVar8 = (this->cache).
               super__Vector_base<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar9 = *(int **)&ppVar8[lVar6].in_equal_constraints.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl;
      piVar3 = *(pointer *)
                ((long)&ppVar8[lVar6].in_equal_constraints.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
      if (piVar9 != piVar3) {
        do {
          iVar1 = *piVar9;
          piVar4 = (this->equal_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar7 = piVar4[iVar1];
          if ((0 < iVar7) && (iVar7 = iVar7 + -1, piVar4[iVar1] = iVar7, iVar7 == 1)) {
            baryonyx::debug<std::basic_string_view<char,std::char_traits<char>>>
                      (this->ctx,"      - equal constraint {} will be removed.\n",
                       &(this->pb->equal_constraints).
                        super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar1].label);
            reduce((preprocessor<baryonyx::problem> *)&stack0xffffffffffffffb4,(constraint *)this);
            if (local_48 < 0) {
              (this->equal_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar1] = 0;
            }
            else {
              iVar7 = local_48;
              if (local_44 == local_4c) {
                iVar7 = -1;
              }
              value = local_4c != 0;
              if (value) {
                iVar7 = local_48;
              }
              if (value && local_44 != local_4c) {
                baryonyx::details::fail_fast
                          ("Reached","cond",
                           "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/preprocessor.cpp"
                           ,"212");
              }
              (this->equal_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar1] = 0;
              if (-1 < iVar7) {
                pp_lifo::emplace(local_40,iVar7,value);
              }
            }
          }
          piVar9 = piVar9 + 1;
        } while (piVar9 != piVar3);
        lVar6 = (long)local_58;
        ppVar8 = (this->cache).
                 super__Vector_base<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      piVar9 = ppVar8[lVar6].in_greater_constraints.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      piVar3 = *(pointer *)
                ((long)&ppVar8[lVar6].in_greater_constraints.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
      if (piVar9 != piVar3) {
        do {
          iVar1 = *piVar9;
          piVar4 = (this->greater_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl
                   .super__Vector_impl_data._M_start;
          iVar7 = piVar4[iVar1];
          if ((0 < iVar7) && (iVar7 = iVar7 + -1, piVar4[iVar1] = iVar7, iVar7 == 1)) {
            baryonyx::debug<std::basic_string_view<char,std::char_traits<char>>>
                      (this->ctx,"      - greater constraint {} will be removed.\n",
                       &(this->pb->greater_constraints).
                        super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar1].label);
            reduce((preprocessor<baryonyx::problem> *)&stack0xffffffffffffffb4,(constraint *)this);
            if (local_48 < 0) {
              (this->greater_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar1] = 0;
            }
            else {
              iVar7 = local_48;
              if (local_4c <= local_44) {
                iVar7 = -1;
              }
              if (0 < local_4c) {
                iVar7 = local_48;
              }
              if (0 < local_4c && local_44 < local_4c) {
                baryonyx::details::fail_fast
                          ("Reached","cond",
                           "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/preprocessor.cpp"
                           ,"237");
              }
              (this->greater_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar1] = 0;
              if (-1 < iVar7) {
                pp_lifo::emplace(local_40,iVar7,0 < local_4c);
              }
            }
          }
          piVar9 = piVar9 + 1;
        } while (piVar9 != piVar3);
        lVar6 = (long)local_58;
        ppVar8 = (this->cache).
                 super__Vector_base<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      piVar3 = *(pointer *)
                ((long)&ppVar8[lVar6].in_less_constraints.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
      for (piVar9 = ppVar8[lVar6].in_less_constraints.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start; piVar9 != piVar3; piVar9 = piVar9 + 1)
      {
        iVar1 = *piVar9;
        piVar4 = (this->less_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar7 = piVar4[iVar1];
        if ((0 < iVar7) && (iVar7 = iVar7 + -1, piVar4[iVar1] = iVar7, iVar7 == 1)) {
          baryonyx::debug<std::basic_string_view<char,std::char_traits<char>>>
                    (this->ctx,"      - less constraint {} will be removed.\n",
                     &(this->pb->less_constraints).
                      super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar1].label);
          reduce((preprocessor<baryonyx::problem> *)&stack0xffffffffffffffb4,(constraint *)this);
          if (local_48 < 0) {
            (this->less_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar1] = 0;
          }
          else {
            iVar7 = local_48;
            if (local_44 <= local_4c) {
              iVar7 = -1;
            }
            if (local_4c < 0) {
              iVar7 = local_48;
            }
            if (local_4c < 0 && local_4c < local_44) {
              baryonyx::details::fail_fast
                        ("Reached","cond",
                         "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/preprocessor.cpp"
                         ,"262");
            }
            (this->less_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar1] = 0;
            if (-1 < iVar7) {
              pp_lifo::emplace(local_40,iVar7,SUB41((uint)local_4c >> 0x1f,0));
            }
          }
        }
      }
      ppVar5 = (this->lifo).data.
               super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while ((this->lifo).data.
             super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
             ._M_impl.super__Vector_impl_data._M_start != ppVar5);
  }
  return;
}

Assistant:

void affects()
    {
        while (!lifo.empty()) {
            auto top = lifo.pop();
            vars.emplace(top.index, top.value);

            debug(ctx,
                  "    - variable {} assigned to {}.\n",
                  pb.vars.names[top.index],
                  top.value);

            for (int cst : cache[top.index].in_equal_constraints) {
                if (equal_constraints[cst] <= 0)
                    continue;

                --equal_constraints[cst];

                if (equal_constraints[cst] == 1) {
                    debug(ctx,
                          "      - equal constraint {} will be removed.\n",
                          pb.equal_constraints[cst].label);

                    auto v =
                      reduce_equal_constraint(pb.equal_constraints[cst]);
                    equal_constraints[cst] = 0;

                    if (std::get<0>(v) >= 0)
                        lifo.emplace(std::get<0>(v), std::get<1>(v));
                }
            }

            for (int cst : cache[top.index].in_greater_constraints) {
                if (greater_constraints[cst] <= 0)
                    continue;

                --greater_constraints[cst];

                if (greater_constraints[cst] == 1) {
                    debug(ctx,
                          "      - greater constraint {} will be removed.\n",
                          pb.greater_constraints[cst].label);

                    auto v =
                      reduce_greater_constraint(pb.greater_constraints[cst]);
                    greater_constraints[cst] = 0;

                    if (std::get<0>(v) >= 0)
                        lifo.emplace(std::get<0>(v), std::get<1>(v));
                }
            }

            for (int cst : cache[top.index].in_less_constraints) {
                if (less_constraints[cst] <= 0)
                    continue;

                --less_constraints[cst];

                if (less_constraints[cst] == 1) {
                    debug(ctx,
                          "      - less constraint {} will be removed.\n",
                          pb.less_constraints[cst].label);

                    auto v = reduce_less_constraint(pb.less_constraints[cst]);
                    less_constraints[cst] = 0;

                    if (std::get<0>(v) >= 0)
                        lifo.emplace(std::get<0>(v), std::get<1>(v));
                }
            }
        }
    }